

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_emit_x86.h
# Opt level: O0

void emit_gri(ASMState *as,x86Group xg,Reg rb,int32_t i)

{
  MCode *pMVar1;
  int iVar2;
  int iVar3;
  byte *pbVar4;
  uint local_5c;
  int32_t *piStack_58;
  x86Op xo;
  MCode *p;
  int32_t i_local;
  Reg rb_local;
  x86Group xg_local;
  ASMState *as_local;
  uint32_t rex;
  int n;
  byte *local_10;
  
  pMVar1 = as->mcp;
  if (i == (char)(MCode)i) {
    piStack_58 = (int32_t *)(pMVar1 + -1);
    pMVar1[-1] = (MCode)i;
    iVar2 = (xg & 0xff0000) * 0x100;
  }
  else {
    piStack_58 = (int32_t *)(pMVar1 + -4);
    *piStack_58 = i;
    iVar2 = (xg & 0xff00) * 0x10000;
  }
  local_5c = iVar2 + 0xfe;
  *(byte *)((long)piStack_58 + -1) = (char)((xg & 7) << 3) + -0x40 + ((byte)rb & 7);
  iVar2 = (int)(char)local_5c;
  if (iVar2 == -0x3c) {
    *(Reg *)((long)piStack_58 + -5) = (rb >> 3 & 1) * 0x2000 ^ local_5c;
    local_10 = (byte *)((long)piStack_58 + -5);
  }
  else {
    *(uint *)((long)piStack_58 + -5) = local_5c;
    pbVar4 = (byte *)((long)piStack_58 + (long)iVar2);
    iVar3 = ((rb & 0x80200) >> 1 & 0x104) + 0x40 + (rb >> 3 & 1);
    _n = pbVar4;
    if (iVar3 != 0x40) {
      as_local._4_1_ = (byte)((rb & 0x80200) >> 0x10) | (byte)iVar3;
      if (iVar2 == -4) {
        *pbVar4 = as_local._4_1_;
        as_local._4_1_ = (byte)(local_5c >> 8);
      }
      else if ((local_5c & 0xffffff) == 0x6600fd) {
        *pbVar4 = as_local._4_1_;
        as_local._4_1_ = 0x66;
      }
      _n = pbVar4 + -1;
      pbVar4[-1] = as_local._4_1_;
    }
    local_10 = _n;
  }
  as->mcp = local_10;
  return;
}

Assistant:

static void emit_gri(ASMState *as, x86Group xg, Reg rb, int32_t i)
{
  MCode *p = as->mcp;
  x86Op xo;
  if (checki8(i)) {
    *--p = (MCode)i;
    xo = XG_TOXOi8(xg);
  } else {
    p -= 4;
    *(int32_t *)p = i;
    xo = XG_TOXOi(xg);
  }
  as->mcp = emit_opm(xo, XM_REG, (Reg)(xg & 7) | (rb & REX_64), rb, p, 0);
}